

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

void __thiscall ipx::Basis::UnfreeVariables(Basis *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar1 = this->model_->num_rows_;
  iVar2 = this->model_->num_cols_;
  uVar4 = iVar2 + iVar1;
  if (uVar4 != 0 && SCARRY4(iVar2,iVar1) == (int)uVar4 < 0) {
    piVar3 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      iVar2 = piVar3[uVar5];
      if (iVar1 <= iVar2) {
        piVar3[uVar5] = iVar2 - iVar1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void Basis::UnfreeVariables() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    for (Int j = 0; j < n+m; j++)
        if (map2basis_[j] >= m)
            map2basis_[j] -= m;
}